

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall
cppcms::application::render(application *this,string *template_name,base_content *content)

{
  context *this_00;
  response *this_01;
  app_guard g;
  response *in_stack_000000e8;
  base_content *in_stack_000000f0;
  ostream *in_stack_000000f8;
  string *in_stack_00000100;
  string *in_stack_00000108;
  manager *in_stack_00000110;
  application *in_stack_ffffffffffffff80;
  base_content *in_stack_ffffffffffffff88;
  app_guard *in_stack_ffffffffffffff90;
  string local_50 [24];
  application *in_stack_ffffffffffffffc8;
  
  base_content::app_guard::app_guard
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  service((application *)0x3b0de4);
  cppcms::service::views_pool((service *)0x3b0df5);
  this_00 = context(in_stack_ffffffffffffffc8);
  http::context::skin_abi_cxx11_(this_00);
  this_01 = response((application *)0x3b0e28);
  http::response::out(in_stack_000000e8);
  views::manager::render
            (in_stack_00000110,in_stack_00000108,in_stack_00000100,in_stack_000000f8,
             in_stack_000000f0);
  std::__cxx11::string::~string(local_50);
  base_content::app_guard::~app_guard((app_guard *)this_01);
  return;
}

Assistant:

void application::render(std::string template_name,base_content &content)
{
	base_content::app_guard g(content,*this);
	service().views_pool().render(context().skin(),template_name,response().out(),content);
}